

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O2

void color_sycc_to_rgb(opj_image_t *img)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  OPJ_INT32 *pOVar5;
  OPJ_INT32 *pOVar6;
  OPJ_INT32 *pOVar7;
  OPJ_INT32 *pOVar8;
  int *piVar9;
  OPJ_INT32 *pOVar10;
  int *piVar11;
  opj_image_comp_t *poVar12;
  int *piVar13;
  int *piVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int *piVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  int *piVar22;
  int iVar23;
  int *piVar24;
  int *piVar25;
  int *piVar26;
  int *piVar27;
  ulong uVar28;
  OPJ_INT32 *out_g;
  OPJ_INT32 *out_b;
  uint uVar29;
  size_t j;
  long lVar30;
  int *local_f8;
  int *local_f0;
  int *local_e8;
  int *local_d8;
  int *local_b0;
  
  if (img->numcomps < 3) {
    img->color_space = OPJ_CLRSPC_GRAY;
  }
  else {
    poVar12 = img->comps;
    if (poVar12->dx != 1) {
LAB_0010ae67:
      fprintf(_stderr,"%s:%d:color_sycc_to_rgb\n\tCAN NOT CONVERT\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/bin/common/color.c"
              ,0x1b1);
      return;
    }
    if (poVar12[1].dx == 1) {
      if ((((poVar12[2].dx != 1) || (poVar12->dy != 1)) || (poVar12[1].dy != 1)) ||
         (poVar12[2].dy != 1)) goto LAB_0010ae67;
      bVar1 = (byte)poVar12->prec;
      lVar30 = (ulong)poVar12->h * (ulong)poVar12->w;
      pOVar6 = poVar12->data;
      pOVar7 = poVar12[1].data;
      pOVar5 = poVar12[2].data;
      lVar21 = lVar30 * 4;
      piVar9 = (int *)opj_image_data_alloc(lVar21);
      pOVar10 = (OPJ_INT32 *)opj_image_data_alloc(lVar21);
      pOVar8 = (OPJ_INT32 *)opj_image_data_alloc(lVar21);
      if (pOVar8 == (OPJ_INT32 *)0x0 || (pOVar10 == (OPJ_INT32 *)0x0 || piVar9 == (int *)0x0)) {
        opj_image_data_free();
        opj_image_data_free(pOVar10);
        goto LAB_0010ae51;
      }
      piVar22 = piVar9;
      out_g = pOVar10;
      out_b = pOVar8;
      for (lVar21 = 0; lVar30 - lVar21 != 0; lVar21 = lVar21 + 1) {
        sycc_to_rgb(1 << (bVar1 - 1 & 0x1f),~(-1 << (bVar1 & 0x1f)),pOVar6[lVar21],pOVar7[lVar21],
                    pOVar5[lVar21],piVar22,out_g,out_b);
        piVar22 = piVar22 + 1;
        out_g = out_g + 1;
        out_b = out_b + 1;
      }
      opj_image_data_free(img->comps->data);
      poVar12 = img->comps;
      poVar12->data = piVar9;
      opj_image_data_free(poVar12[1].data);
      poVar12 = img->comps;
      poVar12[1].data = pOVar10;
      opj_image_data_free(poVar12[2].data);
      img->comps[2].data = pOVar8;
    }
    else {
      if (poVar12[1].dx != 2) goto LAB_0010ae67;
      if (((poVar12[2].dx == 2) && (poVar12->dy == 1)) &&
         ((poVar12[1].dy == 2 && (poVar12[2].dy == 2)))) {
        bVar1 = (byte)poVar12->prec;
        iVar23 = 1 << (bVar1 - 1 & 0x1f);
        uVar2 = poVar12->w;
        uVar16 = (ulong)uVar2;
        uVar3 = poVar12->h;
        local_f0 = poVar12->data;
        piVar9 = poVar12[1].data;
        piVar22 = poVar12[2].data;
        lVar21 = uVar16 * uVar3 * 4;
        pOVar6 = (OPJ_INT32 *)opj_image_data_alloc(lVar21);
        pOVar7 = (OPJ_INT32 *)opj_image_data_alloc(lVar21);
        pOVar8 = (OPJ_INT32 *)opj_image_data_alloc(lVar21);
        if (pOVar8 == (OPJ_INT32 *)0x0 || (pOVar7 == (OPJ_INT32 *)0x0 || pOVar6 == (OPJ_INT32 *)0x0)
           ) {
          opj_image_data_free(pOVar6);
          opj_image_data_free(pOVar7);
LAB_0010ae51:
          opj_image_data_free(pOVar8);
          return;
        }
        uVar29 = ~(-1 << (bVar1 & 0x1f));
        uVar15 = img->x0 & 1;
        uVar20 = uVar16 - uVar15;
        uVar28 = (ulong)(img->y0 & 1);
        uVar17 = uVar3 - uVar28;
        uVar19 = uVar16;
        local_d8 = pOVar7;
        local_b0 = pOVar6;
        piVar27 = pOVar8;
        if (uVar28 != 0) {
          while (uVar19 != 0) {
            sycc_to_rgb(iVar23,uVar29,*local_f0,0,0,local_b0,local_d8,piVar27);
            local_f0 = local_f0 + 1;
            uVar19 = uVar19 - 1;
            local_d8 = local_d8 + 1;
            local_b0 = local_b0 + 1;
            piVar27 = piVar27 + 1;
          }
        }
        for (uVar19 = 0; uVar19 < (uVar17 & 0xfffffffffffffffe); uVar19 = uVar19 + 2) {
          piVar11 = local_f0 + uVar16;
          piVar18 = local_b0 + uVar16;
          piVar26 = local_d8 + uVar16;
          local_f8 = piVar27 + uVar16;
          if (uVar15 != 0) {
            sycc_to_rgb(iVar23,uVar29,*local_f0,0,0,local_b0,local_d8,piVar27);
            local_f0 = local_f0 + 1;
            local_b0 = local_b0 + 1;
            local_d8 = local_d8 + 1;
            piVar27 = piVar27 + 1;
            sycc_to_rgb(iVar23,uVar29,*piVar11,*piVar9,*piVar22,piVar18,piVar26,local_f8);
            piVar11 = piVar11 + 1;
            piVar18 = piVar18 + 1;
            piVar26 = piVar26 + 1;
            local_f8 = local_f8 + 1;
          }
          lVar21 = 0;
          uVar28 = 0;
          while( true ) {
            piVar25 = (int *)((long)piVar27 + lVar21);
            piVar24 = (int *)((long)local_d8 + lVar21);
            piVar13 = (int *)((long)local_b0 + lVar21);
            if ((uVar20 & 0xfffffffffffffffe) <= uVar28) break;
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)local_f0 + lVar21),*piVar9,*piVar22,piVar13,
                        piVar24,piVar25);
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)local_f0 + lVar21 + 4),*piVar9,*piVar22,
                        (int *)((long)local_b0 + lVar21 + 4),(int *)((long)local_d8 + lVar21 + 4),
                        (int *)((long)piVar27 + lVar21 + 4));
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)piVar11 + lVar21),*piVar9,*piVar22,
                        (int *)((long)piVar18 + lVar21),(int *)((long)piVar26 + lVar21),
                        (int *)((long)local_f8 + lVar21));
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)piVar11 + lVar21 + 4),*piVar9,*piVar22,
                        (int *)((long)piVar18 + lVar21 + 4),(int *)((long)piVar26 + lVar21 + 4),
                        (int *)((long)local_f8 + lVar21 + 4));
            piVar9 = piVar9 + 1;
            piVar22 = piVar22 + 1;
            uVar28 = uVar28 + 2;
            lVar21 = lVar21 + 8;
          }
          if (uVar28 < uVar20) {
            piVar14 = (int *)((long)local_f0 + lVar21) + 1;
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)local_f0 + lVar21),*piVar9,*piVar22,piVar13,
                        piVar24,piVar25);
            piVar13 = (int *)((long)local_b0 + lVar21 + 4);
            piVar24 = (int *)((long)local_d8 + lVar21 + 4);
            piVar25 = (int *)((long)piVar27 + lVar21 + 4);
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)piVar11 + lVar21),*piVar9,*piVar22,
                        (int *)((long)piVar18 + lVar21),(int *)((long)piVar26 + lVar21),
                        (int *)((long)local_f8 + lVar21));
            piVar9 = piVar9 + 1;
            piVar22 = piVar22 + 1;
          }
          else {
            piVar14 = (int *)((long)local_f0 + lVar21);
          }
          local_f0 = piVar14 + uVar16;
          local_b0 = piVar13 + uVar16;
          local_d8 = piVar24 + uVar16;
          piVar27 = piVar25 + uVar16;
        }
        if (uVar19 < uVar17) {
          lVar21 = 0;
          uVar19 = 0;
          while( true ) {
            if ((uVar2 & 0xfffffffe) <= uVar19) break;
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)local_f0 + lVar21),
                        *(int *)((long)piVar9 + uVar19 * 2),*(int *)((long)piVar22 + uVar19 * 2),
                        (int *)(lVar21 + (long)local_b0),(int *)((long)local_d8 + lVar21),
                        (int *)((long)piVar27 + lVar21));
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)local_f0 + lVar21 + 4),
                        *(int *)((long)piVar9 + uVar19 * 2),*(int *)((long)piVar22 + uVar19 * 2),
                        (int *)((long)local_b0 + lVar21 + 4),(int *)((long)local_d8 + lVar21 + 4),
                        (int *)((long)piVar27 + lVar21 + 4));
            uVar19 = uVar19 + 2;
            lVar21 = lVar21 + 8;
          }
          if (uVar19 < uVar16) {
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)local_f0 + lVar21),
                        *(int *)((long)piVar9 + uVar19 * 2),*(int *)((long)piVar22 + uVar19 * 2),
                        (int *)(lVar21 + (long)local_b0),(int *)((long)local_d8 + lVar21),
                        (int *)((long)piVar27 + lVar21));
          }
        }
        opj_image_data_free(img->comps->data);
        poVar12 = img->comps;
        poVar12->data = pOVar6;
        opj_image_data_free(poVar12[1].data);
        poVar12 = img->comps;
        poVar12[1].data = pOVar7;
        opj_image_data_free(poVar12[2].data);
        poVar12 = img->comps;
      }
      else {
        if (((poVar12[2].dx != 2) || (poVar12->dy != 1)) ||
           ((poVar12[1].dy != 1 || (poVar12[2].dy != 1)))) goto LAB_0010ae67;
        bVar1 = (byte)poVar12->prec;
        iVar23 = 1 << (bVar1 - 1 & 0x1f);
        uVar2 = poVar12->w;
        uVar3 = poVar12->h;
        local_e8 = poVar12->data;
        piVar9 = poVar12[1].data;
        piVar22 = poVar12[2].data;
        lVar21 = (ulong)uVar2 * (ulong)uVar3 * 4;
        pOVar6 = (OPJ_INT32 *)opj_image_data_alloc(lVar21);
        pOVar7 = (OPJ_INT32 *)opj_image_data_alloc(lVar21);
        pOVar8 = (OPJ_INT32 *)opj_image_data_alloc(lVar21);
        if (pOVar8 == (OPJ_INT32 *)0x0 || (pOVar7 == (OPJ_INT32 *)0x0 || pOVar6 == (OPJ_INT32 *)0x0)
           ) {
          opj_image_data_free();
          opj_image_data_free(pOVar7);
          goto LAB_0010ae51;
        }
        uVar29 = ~(-1 << (bVar1 & 0x1f));
        uVar15 = img->x0 & 1;
        uVar19 = (ulong)uVar2 - (ulong)uVar15;
        piVar11 = pOVar7;
        piVar26 = pOVar6;
        piVar27 = pOVar8;
        for (uVar16 = 0; uVar16 != uVar3; uVar16 = uVar16 + 1) {
          piVar18 = piVar26;
          piVar25 = piVar27;
          piVar24 = piVar11;
          if (uVar15 != 0) {
            sycc_to_rgb(iVar23,uVar29,*local_e8,0,0,piVar26,piVar11,piVar27);
            local_e8 = local_e8 + 1;
            piVar18 = piVar26 + 1;
            piVar25 = piVar27 + 1;
            piVar24 = piVar11 + 1;
          }
          lVar21 = 0;
          uVar28 = 0;
          while( true ) {
            piVar27 = (int *)((long)piVar25 + lVar21);
            piVar11 = (int *)((long)piVar24 + lVar21);
            piVar26 = (int *)((long)piVar18 + lVar21);
            if ((uVar19 & 0xfffffffffffffffe) <= uVar28) break;
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)local_e8 + lVar21),*piVar9,*piVar22,piVar26,
                        piVar11,piVar27);
            sycc_to_rgb(iVar23,uVar29,*(int *)((long)local_e8 + lVar21 + 4),*piVar9,*piVar22,
                        (int *)((long)piVar18 + lVar21 + 4),(int *)((long)piVar24 + lVar21 + 4),
                        (int *)((long)piVar25 + lVar21 + 4));
            piVar9 = piVar9 + 1;
            piVar22 = piVar22 + 1;
            uVar28 = uVar28 + 2;
            lVar21 = lVar21 + 8;
          }
          if (uVar28 < uVar19) {
            piVar13 = (int *)((long)local_e8 + lVar21);
            local_e8 = piVar13 + 1;
            sycc_to_rgb(iVar23,uVar29,*piVar13,*piVar9,*piVar22,piVar26,piVar11,piVar27);
            piVar26 = (int *)((long)piVar18 + lVar21 + 4);
            piVar11 = (int *)((long)piVar24 + lVar21 + 4);
            piVar27 = (int *)((long)piVar25 + lVar21 + 4);
            piVar9 = piVar9 + 1;
            piVar22 = piVar22 + 1;
          }
          else {
            local_e8 = (int *)((long)local_e8 + lVar21);
          }
        }
        opj_image_data_free(img->comps->data);
        poVar12 = img->comps;
        poVar12->data = pOVar6;
        opj_image_data_free(poVar12[1].data);
        poVar12 = img->comps;
        poVar12[1].data = pOVar7;
        opj_image_data_free(poVar12[2].data);
        poVar12 = img->comps;
      }
      poVar12[2].data = pOVar8;
      poVar12[2].w = poVar12->w;
      poVar12[1].w = poVar12->w;
      poVar12[2].h = poVar12->h;
      poVar12[1].h = poVar12->h;
      OVar4 = poVar12->dy;
      poVar12[2].dx = poVar12->dx;
      poVar12[1].dx = poVar12->dx;
      poVar12[2].dy = OVar4;
      poVar12[1].dy = OVar4;
    }
    img->color_space = OPJ_CLRSPC_SRGB;
  }
  return;
}

Assistant:

void color_sycc_to_rgb(opj_image_t *img)
{
    if (img->numcomps < 3) {
        img->color_space = OPJ_CLRSPC_GRAY;
        return;
    }

    if ((img->comps[0].dx == 1)
            && (img->comps[1].dx == 2)
            && (img->comps[2].dx == 2)
            && (img->comps[0].dy == 1)
            && (img->comps[1].dy == 2)
            && (img->comps[2].dy == 2)) { /* horizontal and vertical sub-sample */
        sycc420_to_rgb(img);
    } else if ((img->comps[0].dx == 1)
               && (img->comps[1].dx == 2)
               && (img->comps[2].dx == 2)
               && (img->comps[0].dy == 1)
               && (img->comps[1].dy == 1)
               && (img->comps[2].dy == 1)) { /* horizontal sub-sample only */
        sycc422_to_rgb(img);
    } else if ((img->comps[0].dx == 1)
               && (img->comps[1].dx == 1)
               && (img->comps[2].dx == 1)
               && (img->comps[0].dy == 1)
               && (img->comps[1].dy == 1)
               && (img->comps[2].dy == 1)) { /* no sub-sample */
        sycc444_to_rgb(img);
    } else {
        fprintf(stderr, "%s:%d:color_sycc_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,
                __LINE__);
        return;
    }
}